

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkCleanNext_rec(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_00;
  int i;
  
  Abc_NtkCleanNext(pNtk);
  for (i = 0; i < pNtk->vBoxes->nSize; i = i + 1) {
    pObj = Abc_NtkBox(pNtk,i);
    pNtk_00 = Abc_ObjModel(pObj);
    Abc_NtkCleanNext_rec(pNtk_00);
  }
  return;
}

Assistant:

void Abc_NtkCleanNext_rec( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; 
    int i;
    Abc_NtkCleanNext( pNtk );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkCleanNext_rec( Abc_ObjModel(pObj) );
}